

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order_relation.cpp
# Opt level: O2

unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> __thiscall
duckdb::OrderRelation::GetQueryNode(OrderRelation *this)

{
  vector<duckdb::OrderByNode,_true> *this_00;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var1;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var2;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> _Var3;
  Relation *pRVar4;
  pointer pSVar5;
  pointer pOVar6;
  reference __args;
  reference pvVar7;
  reference pvVar8;
  pointer pPVar9;
  long in_RSI;
  idx_t i;
  ulong __n;
  _Head_base<0UL,_duckdb::TableRef_*,_false> local_50;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_48;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> local_40;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_38;
  
  local_38._M_head_impl = (QueryNode *)this;
  make_uniq<duckdb::SelectNode>();
  pRVar4 = shared_ptr<duckdb::Relation,_true>::operator->
                     ((shared_ptr<duckdb::Relation,_true> *)(in_RSI + 0x80));
  (*pRVar4->_vptr_Relation[7])(&local_50,pRVar4);
  pSVar5 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::operator->
                     ((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                       *)&local_40);
  _Var2._M_head_impl = local_50._M_head_impl;
  local_50._M_head_impl = (TableRef *)0x0;
  _Var1._M_head_impl =
       (pSVar5->from_table).
       super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
       super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
  (pSVar5->from_table).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
  _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
  super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (TableRef *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_TableRef + 8))();
    if (local_50._M_head_impl != (TableRef *)0x0) {
      (*(local_50._M_head_impl)->_vptr_TableRef[1])();
    }
  }
  pSVar5 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::operator->
                     ((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                       *)&local_40);
  make_uniq<duckdb::StarExpression>();
  local_50._M_head_impl = (TableRef *)local_48._M_head_impl;
  local_48._M_head_impl = (ParsedExpression *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
              *)&pSVar5->select_list,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_50);
  if (local_50._M_head_impl != (TableRef *)0x0) {
    (*(local_50._M_head_impl)->_vptr_TableRef[1])();
  }
  local_50._M_head_impl = (TableRef *)0x0;
  if (local_48._M_head_impl != (ParsedExpression *)0x0) {
    (*((local_48._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  make_uniq<duckdb::OrderModifier>();
  this_00 = (vector<duckdb::OrderByNode,_true> *)(in_RSI + 0x68);
  for (__n = 0; __n < (ulong)(*(long *)(in_RSI + 0x70) - *(long *)(in_RSI + 0x68) >> 4);
      __n = __n + 1) {
    pOVar6 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>::
             operator->((unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                         *)&local_50);
    __args = vector<duckdb::OrderByNode,_true>::get<true>(this_00,__n);
    pvVar7 = vector<duckdb::OrderByNode,_true>::get<true>(this_00,__n);
    pvVar8 = vector<duckdb::OrderByNode,_true>::get<true>(this_00,__n);
    pPVar9 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(&pvVar8->expression);
    (*(pPVar9->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_48,pPVar9);
    ::std::vector<duckdb::OrderByNode,std::allocator<duckdb::OrderByNode>>::
    emplace_back<duckdb::OrderType&,duckdb::OrderByNullType&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::OrderByNode,std::allocator<duckdb::OrderByNode>> *)&pOVar6->orders,
               &__args->type,&pvVar7->null_order,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_48);
    if (local_48._M_head_impl != (ParsedExpression *)0x0) {
      (*((local_48._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
  pSVar5 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::operator->
                     ((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                       *)&local_40);
  local_48._M_head_impl = (ParsedExpression *)local_50._M_head_impl;
  local_50._M_head_impl = (TableRef *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>>
              *)&(pSVar5->super_QueryNode).modifiers,
             (unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
              *)&local_48);
  if ((TableRef *)local_48._M_head_impl != (TableRef *)0x0) {
    (*((local_48._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  _Var3._M_head_impl = local_40._M_head_impl;
  local_40._M_head_impl = (SelectNode *)0x0;
  (local_38._M_head_impl)->_vptr_QueryNode = (_func_int **)_Var3._M_head_impl;
  if (local_50._M_head_impl != (TableRef *)0x0) {
    (*(local_50._M_head_impl)->_vptr_TableRef[1])();
    if (local_40._M_head_impl != (SelectNode *)0x0) {
      (*((local_40._M_head_impl)->super_QueryNode)._vptr_QueryNode[1])();
    }
  }
  return (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)
         (_Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>)
         local_38._M_head_impl;
}

Assistant:

unique_ptr<QueryNode> OrderRelation::GetQueryNode() {
	auto select = make_uniq<SelectNode>();
	select->from_table = child->GetTableRef();
	select->select_list.push_back(make_uniq<StarExpression>());
	auto order_node = make_uniq<OrderModifier>();
	for (idx_t i = 0; i < orders.size(); i++) {
		order_node->orders.emplace_back(orders[i].type, orders[i].null_order, orders[i].expression->Copy());
	}
	select->modifiers.push_back(std::move(order_node));
	return std::move(select);
}